

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_setup.cpp
# Opt level: O3

void SetTextureNoErr(side_t *side,int position,DWORD *color,char *name,bool *validcolor,bool isFog)

{
  bool bVar1;
  byte bVar2;
  FTextureID FVar3;
  int iVar4;
  size_t sVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  byte bVar9;
  uint uVar10;
  long lVar11;
  char name2 [9];
  char local_4d [6];
  byte local_47;
  undefined1 local_46;
  int local_44;
  DWORD *local_40;
  char *local_38;
  
  *validcolor = false;
  FVar3 = FTextureManager::CheckForTexture(&TexMan,name,1,3);
  if (FVar3.texnum < 0) {
    local_40 = color;
    strncpy(local_4d,name + 1,7);
    local_46 = 0;
    if (*name == '#') {
      sVar5 = strlen(name);
      *validcolor = false;
      if ((int)sVar5 < 7) {
        FVar3.texnum = 0;
        goto LAB_004488ac;
      }
      lVar11 = 0;
      do {
        iVar4 = isxdigit((int)local_4d[lVar11]);
        if (iVar4 == 0) {
          local_4d[lVar11] = '0';
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 != 6);
      uVar10 = 0;
      local_44 = 0;
      if ((int)sVar5 != 7) {
        bVar9 = 0x5a;
        if ((local_47 & 0xdf) < 0x5a) {
          bVar9 = local_47 & 0xdf;
        }
        bVar2 = 0x41;
        if (0x41 < bVar9) {
          bVar2 = bVar9;
        }
        local_44 = bVar2 - 0x41;
      }
      local_47 = 0;
      lVar11 = strtol(local_4d + 4,(char **)0x0,0x10);
      local_4d[4] = 0;
      lVar7 = strtol(local_4d + 2,(char **)0x0,0x10);
      local_4d[2] = 0;
      lVar8 = strtol(local_4d,(char **)0x0,0x10);
      if (!isFog) {
        if (local_44 == 0) {
          bVar1 = false;
          goto LAB_00448a41;
        }
        uVar10 = (local_44 * 0xff & 0xffffU) * 0x47af >> 0x10;
        uVar10 = (((local_44 * 0xff - uVar10 & 0xffff) >> 1) + uVar10 & 0xfffffff0) << 0x14;
      }
      *local_40 = (int)lVar7 << 8 | (uint)lVar11 | (int)lVar8 << 0x10 | uVar10;
      bVar1 = true;
    }
    else {
      uVar6 = strtoul(name,&local_38,0x10);
      *local_40 = (DWORD)uVar6;
      bVar1 = (local_38 <= name + 6 && name + 2 <= local_38) && *local_38 == '\0';
    }
LAB_00448a41:
    *validcolor = bVar1;
  }
  else {
LAB_004488ac:
    side->textures[position].texture.texnum = FVar3.texnum;
  }
  return;
}

Assistant:

static void SetTextureNoErr (side_t *side, int position, DWORD *color, const char *name, bool *validcolor, bool isFog)
{
	FTextureID texture;
	*validcolor = false;
	texture = TexMan.CheckForTexture (name, FTexture::TEX_Wall,	
		FTextureManager::TEXMAN_Overridable|FTextureManager::TEXMAN_TryAny);
	if (!texture.Exists())
	{
		char name2[9];
		char *stop;
		strncpy (name2, name+1, 7);
		name2[7] = 0;
		if (*name != '#')
		{
			*color = strtoul (name, &stop, 16);
			texture = FNullTextureID();
			*validcolor = (*stop == 0) && (stop >= name + 2) && (stop <= name + 6);
			return;
		}
		else	// Support for Legacy's color format!
		{
			int l=(int)strlen(name);
			texture = FNullTextureID();
			*validcolor = false;
			if (l>=7) 
			{
				for(stop=name2;stop<name2+6;stop++) if (!isxdigit(*stop)) *stop='0';

				int factor = l==7? 0 : clamp<int> ((name2[6]&223)-'A', 0, 25);

				name2[6]=0; int blue=strtol(name2+4,NULL,16);
				name2[4]=0; int green=strtol(name2+2,NULL,16);
				name2[2]=0; int red=strtol(name2,NULL,16);

				if (!isFog) 
				{
					if (factor==0) 
					{
						*validcolor=false;
						return;
					}
					factor = factor * 255 / 25;
				}
				else
				{
					factor=0;
				}

				*color=MAKEARGB(factor, red, green, blue);
				texture = FNullTextureID();
				*validcolor = true;
				return;
			}
		}
		texture = FNullTextureID();
	}
	side->SetTexture(position, texture);
}